

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O3

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator&=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 *p;
  uint32 *puVar1;
  uint uVar2;
  uint j;
  long lVar3;
  uint32 oc;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (this != other) {
    uVar2 = other->m_num_groups;
    if (uVar2 != this->m_num_groups) {
      crnlib_assert("other.m_num_groups == m_num_groups",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                    ,0x172);
      uVar2 = this->m_num_groups;
    }
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        p = this->m_ppGroups[uVar6];
        if (p != (uint32 *)0x0) {
          puVar1 = other->m_ppGroups[uVar6];
          if (puVar1 != (uint32 *)0x0) {
            lVar3 = 0;
            uVar4 = 0;
            do {
              uVar5 = puVar1[lVar3] & p[lVar3];
              p[lVar3] = uVar5;
              uVar4 = uVar4 | uVar5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x10);
            if (uVar4 != 0) goto LAB_00147b20;
          }
          crnlib_free(p);
          this->m_ppGroups[uVar6] = (uint32 *)0x0;
        }
LAB_00147b20:
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->m_num_groups);
    }
  }
  return this;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator&=(const sparse_bit_array& other)
    {
        if (this == &other)
        {
            return *this;
        }

        CRNLIB_VERIFY(other.m_num_groups == m_num_groups);

        for (uint i = 0; i < m_num_groups; i++)
        {
            uint32* d = m_ppGroups[i];
            if (!d)
            {
                continue;
            }
            uint32* s = other.m_ppGroups[i];

            if (!s)
            {
                free_group(d);
                m_ppGroups[i] = nullptr;
            }
            else
            {
                uint32 oc = 0;
                for (uint j = 0; j < cDWORDsPerGroup; j++)
                {
                    uint32 c = d[j] & s[j];
                    d[j] = c;
                    oc |= c;
                }
                if (!oc)
                {
                    free_group(d);
                    m_ppGroups[i] = nullptr;
                }
            }
        }

        return *this;
    }